

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O1

string * __thiscall
t_php_generator::type_to_phpdoc_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type)

{
  undefined1 *puVar1;
  long lVar2;
  string *psVar3;
  int iVar4;
  t_type *ptVar5;
  undefined4 extraout_var;
  long *plVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  string local_60;
  string local_40;
  
  ptVar5 = t_type::get_true_type(type);
  iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[5])(ptVar5);
  if ((char)iVar4 == '\0') {
    iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[10])(ptVar5);
    if ((char)iVar4 == '\0') {
      iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xb])(ptVar5);
      if (((char)iVar4 == '\0') &&
         (iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xc])(ptVar5), (char)iVar4 == '\0')) {
        iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0x10])(ptVar5);
        if ((char)iVar4 != '\0') {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar9 = "array";
          pcVar8 = "";
          goto LAB_0030b9fb;
        }
        iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xf])(ptVar5);
        if ((char)iVar4 == '\0') {
          iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xe])(ptVar5);
          if ((char)iVar4 == '\0') goto switchD_0030b9c0_default;
          ptVar5 = *(t_type **)&ptVar5[1].super_t_doc.has_doc_;
          iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xd])(ptVar5);
          if ((char)iVar4 == '\0') {
            type_to_phpdoc_abi_cxx11_(&local_60,this,ptVar5);
            std::operator+(__return_storage_ptr__,&local_60,"[]");
            goto LAB_0030ba9a;
          }
          type_to_phpdoc_abi_cxx11_(&local_40,this,ptVar5);
          std::operator+(&local_60,"(",&local_40);
          std::operator+(__return_storage_ptr__,&local_60,")[]");
        }
        else {
          ptVar5 = *(t_type **)&ptVar5[1].super_t_doc.has_doc_;
          iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[0xd])(ptVar5);
          if ((char)iVar4 == '\0') {
            type_to_phpdoc_abi_cxx11_(&local_60,this,ptVar5);
            std::operator+(__return_storage_ptr__,&local_60,"[]");
            goto LAB_0030ba9a;
          }
          type_to_phpdoc_abi_cxx11_(&local_40,this,ptVar5);
          std::operator+(&local_60,"(",&local_40);
          std::operator+(__return_storage_ptr__,&local_60,")[]");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p);
        }
        psVar3 = &local_40;
      }
      else {
        php_namespace_abi_cxx11_(&local_60,this,ptVar5->program_);
        iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[3])(ptVar5);
        plVar6 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_60,*(ulong *)CONCAT44(extraout_var,iVar4));
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)*plVar6 == psVar7) {
          lVar2 = plVar6[3];
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
          *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
        }
        else {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
          (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        }
        __return_storage_ptr__->_M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
LAB_0030ba9a:
        psVar3 = &local_60;
      }
      puVar1 = *(undefined1 **)((psVar3->field_2)._M_local_buf + -0x10);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 == &psVar3->field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(puVar1);
      return __return_storage_ptr__;
    }
switchD_0030b9c0_caseD_3:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar9 = "int";
    pcVar8 = "";
  }
  else {
    switch(*(undefined4 *)&ptVar5[1].super_t_doc._vptr_t_doc) {
    case 0:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "void";
      pcVar8 = "";
      break;
    case 1:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "string";
      pcVar8 = "";
      break;
    case 2:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "bool";
      pcVar8 = "";
      break;
    case 3:
    case 4:
    case 5:
    case 6:
      goto switchD_0030b9c0_caseD_3;
    case 7:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "double";
      pcVar8 = "";
      break;
    default:
switchD_0030b9c0_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar4 = (*(ptVar5->super_t_doc)._vptr_t_doc[3])(ptVar5);
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar4));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
LAB_0030b9fb:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::type_to_phpdoc(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "void";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "int";
    case t_base_type::TYPE_I64:
      return "int";
    case t_base_type::TYPE_DOUBLE:
      return "double";
    }
  } else if (type->is_enum()) {
    return "int";
  } else if (type->is_struct() || type->is_xception()) {
    return php_namespace(type->get_program()) + type->get_name();
  } else if (type->is_map()) {
    return "array";
  } else if (type->is_set()) {
    t_set* tset = static_cast<t_set*>(type);
    t_type* t_elem = tset->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  } else if (type->is_list()) {
    t_list* tlist = static_cast<t_list*>(type);
    t_type* t_elem = tlist->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}